

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_urlglob.c
# Opt level: O1

CURLcode glob_match_url(char **result,char *filename,URLGlob *glob)

{
  char *pcVar1;
  URLPatternType UVar2;
  char **ppcVar3;
  bool bVar4;
  int iVar5;
  CURLcode CVar6;
  URLGlob *pUVar7;
  char *pcVar8;
  size_t sVar9;
  size_t len;
  char *pcVar10;
  curl_off_t num;
  char numbuf [18];
  dynbuf dyn;
  char *local_80;
  long local_78;
  char **local_70;
  char local_68 [24];
  dynbuf local_50;
  
  *result = (char *)0x0;
  local_80 = filename;
  local_70 = result;
  curlx_dyn_init(&local_50,0x2800);
  len = 0;
  pcVar8 = "";
  do {
    pcVar10 = local_80;
    if (*local_80 == '#') {
      if (9 < (byte)(local_80[1] - 0x30U)) goto LAB_0011ef17;
      pcVar1 = local_80 + 1;
      local_80 = pcVar1;
      iVar5 = Curl_str_number(&local_80,&local_78,glob->size);
      if (local_78 != 0 && iVar5 == 0) {
        local_78 = local_78 + -1;
        pUVar7 = glob;
        for (sVar9 = glob->size; sVar9 != 0; sVar9 = sVar9 - 1) {
          if (pUVar7->pattern[0].globindex == (int)local_78) goto LAB_0011eed5;
          pUVar7 = (URLGlob *)(pUVar7->pattern + 1);
        }
      }
      pUVar7 = (URLGlob *)0x0;
LAB_0011eed5:
      if (pUVar7 == (URLGlob *)0x0) {
        bVar4 = true;
        len = 1;
        local_80 = pcVar1;
      }
      else {
        UVar2 = pUVar7->pattern[0].type;
        if (UVar2 == UPTNumRange) {
          pcVar10 = local_68;
          curl_msnprintf(pcVar10,0x12,"%0*ld",pUVar7->pattern[0].content.Set.ptr_s,
                         pUVar7->pattern[0].content.NumRange.ptr_n);
          len = strlen(pcVar10);
          bVar4 = true;
        }
        else if (UVar2 == UPTCharRange) {
          local_68[0] = pUVar7->pattern[0].content.CharRange.ptr_c;
          local_68[1] = 0;
          bVar4 = true;
          len = 1;
          pcVar10 = local_68;
        }
        else {
          pcVar10 = pcVar8;
          if (UVar2 == UPTSet) {
            ppcVar3 = pUVar7->pattern[0].content.Set.elements;
            bVar4 = true;
            if (ppcVar3 != (char **)0x0) {
              pcVar10 = ppcVar3[pUVar7->pattern[0].content.Set.ptr_s];
              len = strlen(pcVar10);
            }
          }
          else {
            bVar4 = false;
            curl_mfprintf(tool_stderr,"internal error: invalid pattern type (%d)\n");
            curlx_dyn_free(&local_50);
          }
        }
      }
      if (!bVar4) {
        return CURLE_FAILED_INIT;
      }
    }
    else {
      if (*local_80 == '\0') {
        CVar6 = curlx_dyn_addn(&local_50,"",0);
        if (CVar6 != CURLE_OK) {
          return CURLE_OUT_OF_MEMORY;
        }
        pcVar8 = curlx_dyn_ptr(&local_50);
        *local_70 = pcVar8;
        return CURLE_OK;
      }
LAB_0011ef17:
      len = 1;
      local_80 = local_80 + 1;
    }
    CVar6 = curlx_dyn_addn(&local_50,pcVar10,len);
    pcVar8 = pcVar10;
    if (CVar6 != CURLE_OK) {
      return CURLE_OUT_OF_MEMORY;
    }
  } while( true );
}

Assistant:

CURLcode glob_match_url(char **result, const char *filename,
                        struct URLGlob *glob)
{
  char numbuf[18];
  const char *appendthis = "";
  size_t appendlen = 0;
  struct curlx_dynbuf dyn;

  *result = NULL;

  /* We cannot use the glob_buffer for storage since the filename may be
   * longer than the URL we use.
   */
  curlx_dyn_init(&dyn, MAX_OUTPUT_GLOB_LENGTH);

  while(*filename) {
    if(*filename == '#' && ISDIGIT(filename[1])) {
      const char *ptr = filename;
      curl_off_t num;
      struct URLPattern *pat = NULL;
      filename++;
      if(!curlx_str_number(&filename, &num, glob->size) && num) {
        unsigned long i;
        num--; /* make it zero based */
        /* find the correct glob entry */
        for(i = 0; i < glob->size; i++) {
          if(glob->pattern[i].globindex == (int)num) {
            pat = &glob->pattern[i];
            break;
          }
        }
      }

      if(pat) {
        switch(pat->type) {
        case UPTSet:
          if(pat->content.Set.elements) {
            appendthis = pat->content.Set.elements[pat->content.Set.ptr_s];
            appendlen =
              strlen(pat->content.Set.elements[pat->content.Set.ptr_s]);
          }
          break;
        case UPTCharRange:
          numbuf[0] = pat->content.CharRange.ptr_c;
          numbuf[1] = 0;
          appendthis = numbuf;
          appendlen = 1;
          break;
        case UPTNumRange:
          msnprintf(numbuf, sizeof(numbuf), "%0*" CURL_FORMAT_CURL_OFF_T,
                    pat->content.NumRange.padlength,
                    pat->content.NumRange.ptr_n);
          appendthis = numbuf;
          appendlen = strlen(numbuf);
          break;
        default:
          fprintf(tool_stderr, "internal error: invalid pattern type (%d)\n",
                  (int)pat->type);
          curlx_dyn_free(&dyn);
          return CURLE_FAILED_INIT;
        }
      }
      else {
        /* #[num] out of range, use the #[num] in the output */
        filename = ptr;
        appendthis = filename++;
        appendlen = 1;
      }
    }
    else {
      appendthis = filename++;
      appendlen = 1;
    }
    if(curlx_dyn_addn(&dyn, appendthis, appendlen))
      return CURLE_OUT_OF_MEMORY;
  }

  if(curlx_dyn_addn(&dyn, "", 0))
    return CURLE_OUT_OF_MEMORY;

#if defined(_WIN32) || defined(MSDOS)
  {
    char *sanitized;
    SANITIZEcode sc = sanitize_file_name(&sanitized, curlx_dyn_ptr(&dyn),
                                         (SANITIZE_ALLOW_PATH |
                                          SANITIZE_ALLOW_RESERVED));
    curlx_dyn_free(&dyn);
    if(sc)
      return CURLE_URL_MALFORMAT;
    *result = sanitized;
    return CURLE_OK;
  }
#else
  *result = curlx_dyn_ptr(&dyn);
  return CURLE_OK;
#endif /* _WIN32 || MSDOS */
}